

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Lexer::CreateSymbol(Lexer *this,string_view name)

{
  map<std::basic_string_view<char,_std::char_traits<char>_>,_Jinx::Impl::SymbolType,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_Jinx::Impl::SymbolType>,_4096UL,_16UL>_>
  *this_00;
  bool bVar1;
  char *pcVar2;
  pointer ppVar3;
  char *extraout_RDX;
  string_view source;
  string_view source_00;
  _Self local_c8;
  __sv_type local_c0;
  _Self local_b0;
  const_iterator itr;
  String local_98;
  Lexer *local_78;
  size_t sStack_70;
  undefined1 local_58 [8];
  Symbol symbol;
  Lexer *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (Lexer *)name._M_len;
  pcVar2 = (char *)(ulong)this->m_columnMarker;
  symbol._48_8_ = this;
  Symbol::Symbol((Symbol *)local_58,NameValue,this->m_lineNumber,this->m_columnMarker);
  std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::operator=
            ((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)&symbol,
             (basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  local_78 = this_local;
  sStack_70 = name_local._M_len;
  source._M_str = extraout_RDX;
  source._M_len = name_local._M_len;
  bVar1 = IsCaseFolded((Impl *)this_local,source);
  if (!bVar1) {
    itr._M_node = (_Base_ptr)this_local;
    source_00._M_str = pcVar2;
    source_00._M_len = name_local._M_len;
    FoldCase_abi_cxx11_(&local_98,(Impl *)this_local,source_00);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::c_str
                       (&local_98);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&symbol,pcVar2)
    ;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              (&local_98);
  }
  this_00 = this->m_symbolTypeMap;
  local_c0 = std::__cxx11::basic_string::operator_cast_to_basic_string_view((basic_string *)&symbol)
  ;
  local_b0._M_node =
       (_Base_ptr)
       std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_Jinx::Impl::SymbolType,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_Jinx::Impl::SymbolType>,_4096UL,_16UL>_>
       ::find(this_00,&local_c0);
  local_c8._M_node =
       (_Base_ptr)
       std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_Jinx::Impl::SymbolType,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_Jinx::Impl::SymbolType>,_4096UL,_16UL>_>
       ::end(this->m_symbolTypeMap);
  bVar1 = std::operator!=(&local_b0,&local_c8);
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_Jinx::Impl::SymbolType>_>
             ::operator->(&local_b0);
    local_58._0_4_ = ppVar3->second;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                            &symbol,"true");
    if (bVar1) {
      local_58._0_4_ = BooleanValue;
      symbol.text.field_2._M_local_buf[8] = '\x01';
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                              &symbol,"false");
      if (bVar1) {
        local_58._0_4_ = BooleanValue;
        symbol.text.field_2._M_local_buf[8] = '\0';
      }
    }
  }
  std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::push_back
            (&this->m_symbolList,(value_type *)local_58);
  this->m_columnMarker = this->m_columnNumber;
  Symbol::~Symbol((Symbol *)local_58);
  return;
}

Assistant:

inline_t void Lexer::CreateSymbol(std::string_view name)
	{
		Symbol symbol(SymbolType::NameValue, m_lineNumber, m_columnMarker);
		symbol.text = name;
		if (!IsCaseFolded(name))
			symbol.text = FoldCase(name).c_str();
		auto itr = m_symbolTypeMap.find(symbol.text);
		if (itr != m_symbolTypeMap.end())
		{
			symbol.type = itr->second;
		}
		else
		{
			// Special case detection of boolean 'true' and 'false' values.  We don't
			// want to make these symbol types.  Instead, they need to be a BooleanValue
			// type.
			if (symbol.text == "true")
			{
				symbol.type = SymbolType::BooleanValue;
				symbol.boolVal = true;
			}
			else if (symbol.text == "false")
			{
				symbol.type = SymbolType::BooleanValue;
				symbol.boolVal = false;
			}
		}
		m_symbolList.push_back(symbol);
		m_columnMarker = m_columnNumber;
	}